

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O1

bool operator==(Quaternion<double> *lhs,Quaternion<double> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = ABS(lhs->n);
  dVar2 = ABS(rhs->n);
  if (dVar2 <= dVar1) {
    dVar2 = dVar1;
  }
  dVar3 = ABS(lhs->ni);
  dVar1 = ABS(rhs->ni);
  if (dVar1 <= dVar3) {
    dVar1 = dVar3;
  }
  dVar4 = ABS(lhs->nj);
  dVar3 = ABS(rhs->nj);
  if (dVar3 <= dVar4) {
    dVar3 = dVar4;
  }
  dVar5 = ABS(lhs->nk);
  dVar4 = ABS(rhs->nk);
  if (dVar4 <= dVar5) {
    dVar4 = dVar5;
  }
  return (bool)((ABS(lhs->nk - rhs->nk) <= dVar4 * 1e-05 && ABS(lhs->nj - rhs->nj) <= dVar3 * 1e-05)
               & -(ABS(lhs->ni - rhs->ni) <= dVar1 * 1e-05) &
                 -(ABS(lhs->n - rhs->n) <= dVar2 * 1e-05));
}

Assistant:

T a() const {
        return this->n;
    }